

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall
mkvparser::Cluster::ParseBlockGroup(Cluster *this,longlong payload_size,longlong *pos,long *len)

{
  int iVar1;
  long lVar2;
  byte local_99;
  int lacing;
  uchar flags;
  longlong track;
  longlong block_stop;
  longlong unknown_size;
  longlong size;
  longlong id;
  longlong result;
  longlong discard_padding;
  long status;
  longlong avail;
  longlong total;
  IMkvReader *pReader;
  longlong payload_stop;
  longlong payload_start;
  long *len_local;
  longlong *pos_local;
  longlong payload_size_local;
  Cluster *this_local;
  
  payload_stop = *pos;
  pReader = (IMkvReader *)(*pos + payload_size);
  total = (longlong)this->m_pSegment->m_pReader;
  payload_start = (longlong)len;
  len_local = pos;
  pos_local = (longlong *)payload_size;
  payload_size_local = (longlong)this;
  iVar1 = (*((IMkvReader *)total)->_vptr_IMkvReader[1])(total,&avail,&status);
  discard_padding = (longlong)iVar1;
  this_local = (Cluster *)discard_padding;
  if (-1 < discard_padding) {
    if (-1 < avail && avail < status) {
      __assert_fail("(total < 0) || (avail <= total)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x19a4,
                    "long mkvparser::Cluster::ParseBlockGroup(long long, long long &, long &)");
    }
    if ((avail < 0) || ((long)pReader <= avail)) {
      if (status < (long)pReader) {
        *(longlong **)payload_start = pos_local;
        this_local = (Cluster *)0xfffffffffffffffd;
      }
      else {
        result = 0;
        do {
          while( true ) {
            do {
              if ((long)pReader <= *len_local) {
                if ((IMkvReader *)*len_local != pReader) {
                  return -2;
                }
                lVar2 = CreateBlock(this,0xa0,payload_stop,(longlong)pos_local,result);
                if (lVar2 != 0) {
                  return lVar2;
                }
                this->m_pos = (longlong)pReader;
                return 0;
              }
              if (status < *len_local + 1) {
                *(undefined8 *)payload_start = 1;
                return -3;
              }
              id = GetUIntLength((IMkvReader *)total,*len_local,(long *)payload_start);
              if (id < 0) {
                return id;
              }
              if (0 < id) {
                return -3;
              }
              if ((long)pReader < *len_local + *(long *)payload_start) {
                return -2;
              }
              if (status < *len_local + *(long *)payload_start) {
                return -3;
              }
              size = ReadID((IMkvReader *)total,*len_local,(long *)payload_start);
              if (size < 0) {
                return size;
              }
              if (size == 0) {
                return -2;
              }
              *len_local = *(long *)payload_start + *len_local;
              if (status < *len_local + 1) {
                *(undefined8 *)payload_start = 1;
                return -3;
              }
              id = GetUIntLength((IMkvReader *)total,*len_local,(long *)payload_start);
              if (id < 0) {
                return id;
              }
              if (0 < id) {
                return -3;
              }
              if ((long)pReader < *len_local + *(long *)payload_start) {
                return -2;
              }
              if (status < *len_local + *(long *)payload_start) {
                return -3;
              }
              unknown_size = ReadUInt((IMkvReader *)total,*len_local,(long *)payload_start);
              if (unknown_size < 0) {
                return unknown_size;
              }
              *len_local = *(long *)payload_start + *len_local;
              if ((long)pReader < *len_local) {
                return -2;
              }
            } while (unknown_size == 0);
            block_stop = (1L << ((char)*(undefined8 *)payload_start * '\a' & 0x3fU)) + -1;
            if (unknown_size == block_stop) {
              return -2;
            }
            if ((size == 0x75a2) &&
               (discard_padding =
                     UnserializeInt((IMkvReader *)total,*len_local,unknown_size,&result),
               discard_padding < 0)) {
              return discard_padding;
            }
            if (size == 0xa1) break;
            *len_local = unknown_size + *len_local;
            if ((long)pReader < *len_local) {
              return -2;
            }
          }
          track = *len_local + unknown_size;
          if ((long)pReader < track) {
            return -2;
          }
          if (status < *len_local + 1) {
            *(undefined8 *)payload_start = 1;
            return -3;
          }
          id = GetUIntLength((IMkvReader *)total,*len_local,(long *)payload_start);
          if (id < 0) {
            return id;
          }
          if (0 < id) {
            return -3;
          }
          if (track < *len_local + *(long *)payload_start) {
            return -2;
          }
          if (status < *len_local + *(long *)payload_start) {
            return -3;
          }
          _lacing = ReadUInt((IMkvReader *)total,*len_local,(long *)payload_start);
          if (_lacing < 0) {
            return _lacing;
          }
          if (_lacing == 0) {
            return -2;
          }
          *len_local = *(long *)payload_start + *len_local;
          if (track < *len_local + 2) {
            return -2;
          }
          if (status < *len_local + 2) {
            *(undefined8 *)payload_start = 2;
            return -3;
          }
          *len_local = *len_local + 2;
          if (track < *len_local + 1) {
            return -2;
          }
          if (status < *len_local + 1) {
            *(undefined8 *)payload_start = 1;
            return -3;
          }
          iVar1 = (*(code *)**(undefined8 **)total)(total,*len_local,1,&local_99);
          discard_padding = (longlong)iVar1;
          if (discard_padding < 0) {
            *(undefined8 *)payload_start = 1;
            return discard_padding;
          }
          *len_local = *len_local + 1;
          if (status < *len_local) {
            __assert_fail("pos <= avail",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x1a49,
                          "long mkvparser::Cluster::ParseBlockGroup(long long, long long &, long &)"
                         );
          }
          if (track <= *len_local) {
            return -2;
          }
          if (((int)(local_99 & 6) >> 1 != 0) && (status < track)) {
            *(longlong *)payload_start = track - *len_local;
            return -3;
          }
          *len_local = track;
        } while (*len_local <= (long)pReader);
        this_local = (Cluster *)0xfffffffffffffffe;
      }
    }
    else {
      this_local = (Cluster *)0xfffffffffffffffe;
    }
  }
  return (long)this_local;
}

Assistant:

long Cluster::ParseBlockGroup(long long payload_size, long long& pos,
                              long& len) {
  const long long payload_start = pos;
  const long long payload_stop = pos + payload_size;

  IMkvReader* const pReader = m_pSegment->m_pReader;

  long long total, avail;

  long status = pReader->Length(&total, &avail);

  if (status < 0)  // error
    return status;

  assert((total < 0) || (avail <= total));

  if ((total >= 0) && (payload_stop > total))
    return E_FILE_FORMAT_INVALID;

  if (payload_stop > avail) {
    len = static_cast<long>(payload_size);
    return E_BUFFER_NOT_FULL;
  }

  long long discard_padding = 0;

  while (pos < payload_stop) {
    // parse sub-block element ID

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    long long result = GetUIntLength(pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // weird
      return E_BUFFER_NOT_FULL;

    if ((pos + len) > payload_stop)
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long id = ReadID(pReader, pos, len);

    if (id < 0)  // error
      return static_cast<long>(id);

    if (id == 0)  // not a valid ID
      return E_FILE_FORMAT_INVALID;

    pos += len;  // consume ID field

    // Parse Size

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    result = GetUIntLength(pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // weird
      return E_BUFFER_NOT_FULL;

    if ((pos + len) > payload_stop)
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long size = ReadUInt(pReader, pos, len);

    if (size < 0)  // error
      return static_cast<long>(size);

    pos += len;  // consume size field

    // pos now points to start of sub-block group payload

    if (pos > payload_stop)
      return E_FILE_FORMAT_INVALID;

    if (size == 0)  // weird
      continue;

    const long long unknown_size = (1LL << (7 * len)) - 1;

    if (size == unknown_size)
      return E_FILE_FORMAT_INVALID;

    if (id == libwebm::kMkvDiscardPadding) {
      status = UnserializeInt(pReader, pos, size, discard_padding);

      if (status < 0)  // error
        return status;
    }

    if (id != libwebm::kMkvBlock) {
      pos += size;  // consume sub-part of block group

      if (pos > payload_stop)
        return E_FILE_FORMAT_INVALID;

      continue;
    }

    const long long block_stop = pos + size;

    if (block_stop > payload_stop)
      return E_FILE_FORMAT_INVALID;

    // parse track number

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    result = GetUIntLength(pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // weird
      return E_BUFFER_NOT_FULL;

    if ((pos + len) > block_stop)
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long track = ReadUInt(pReader, pos, len);

    if (track < 0)  // error
      return static_cast<long>(track);

    if (track == 0)
      return E_FILE_FORMAT_INVALID;

    pos += len;  // consume track number

    if ((pos + 2) > block_stop)
      return E_FILE_FORMAT_INVALID;

    if ((pos + 2) > avail) {
      len = 2;
      return E_BUFFER_NOT_FULL;
    }

    pos += 2;  // consume timecode

    if ((pos + 1) > block_stop)
      return E_FILE_FORMAT_INVALID;

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    unsigned char flags;

    status = pReader->Read(pos, 1, &flags);

    if (status < 0) {  // error or underflow
      len = 1;
      return status;
    }

    ++pos;  // consume flags byte
    assert(pos <= avail);

    if (pos >= block_stop)
      return E_FILE_FORMAT_INVALID;

    const int lacing = int(flags & 0x06) >> 1;

    if ((lacing != 0) && (block_stop > avail)) {
      len = static_cast<long>(block_stop - pos);
      return E_BUFFER_NOT_FULL;
    }

    pos = block_stop;  // consume block-part of block group
    if (pos > payload_stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != payload_stop)
    return E_FILE_FORMAT_INVALID;

  status = CreateBlock(libwebm::kMkvBlockGroup, payload_start, payload_size,
                       discard_padding);
  if (status != 0)
    return status;

  m_pos = payload_stop;

  return 0;  // success
}